

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::detail::AtMatcher<iutest::detail::GtMatcher<int>>::operator()
          (AssertionResult *__return_storage_ptr__,AtMatcher<iutest::detail::GtMatcher<int>> *this,
          vector<int,_std::allocator<int>_> *actual)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  AssertionResult *pAVar4;
  AssertionResult local_a0;
  AssertionResult local_78;
  AssertionResult local_50;
  
  GtMatcher<int>::operator()
            (&local_50,(GtMatcher<int> *)(this + 0x10),
             (actual->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start + *(long *)(this + 8));
  AssertionResult::operator!(&local_a0,&local_50);
  AssertionResult::operator!(&local_78,&local_a0);
  paVar1 = &local_78.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_message._M_dataplus._M_p,
                    CONCAT71(local_78.m_message.field_2._M_allocated_capacity._1_7_,
                             local_78.m_message.field_2._M_local_buf[0]) + 1);
  }
  paVar2 = &local_a0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.m_message._M_dataplus._M_p,
                    local_a0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_78.m_result == false) {
    local_78.m_message._M_string_length = 0;
    local_78.m_message.field_2._M_local_buf[0] = '\0';
    local_78.m_result = false;
    local_78.m_message._M_dataplus._M_p = (pointer)paVar1;
    WhichIs_abi_cxx11_(&local_a0.m_message,this);
    pAVar4 = AssertionResult::operator<<(&local_78,&local_a0.m_message);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar3 = (pAVar4->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pAVar4->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar4->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0.m_message._M_dataplus._M_p,
                      local_a0.m_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.m_message._M_dataplus._M_p,
                      CONCAT71(local_78.m_message.field_2._M_allocated_capacity._1_7_,
                               local_78.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( CastToMatcher(m_expected)(actual[m_index]) )
        {
            return AssertionSuccess();
        }